

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool (anonymous_namespace)::readWaveform<float,short>
               (ifstream *fin,TWaveformT<short> *res,int32_t offset,streamsize size)

{
  pointer psVar1;
  undefined1 uVar2;
  undefined1 extraout_AL;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  vector<float,_std::allocator<float>_> buf;
  allocator_type local_61;
  vector<float,_std::allocator<float>_> local_60;
  double local_48;
  undefined8 uStack_40;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(ulong)size >> 2,&local_61);
  std::vector<short,_std::allocator<short>_>::resize(res,((ulong)size >> 2) + (long)offset);
  uVar2 = std::istream::read((char *)fin,
                             (long)local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
  uVar4 = (uint)((ulong)((long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar4 < 1) {
    if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return (bool)uVar2;
    }
  }
  else {
    uVar3 = 0;
    dVar6 = 0.0;
    do {
      dVar5 = (double)ABS(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      if ((double)ABS(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar3]) <= dVar6) {
        dVar5 = dVar6;
      }
      uVar3 = uVar3 + 1;
      dVar6 = dVar5;
    } while ((uVar4 & 0x7fffffff) != uVar3);
    if (0 < (int)uVar4) {
      local_48 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                         (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
      uStack_40 = 0;
      psVar1 = (res->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = 0;
      do {
        dVar6 = round((double)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3] * local_48 * 32767.0);
        psVar1[(long)offset + uVar3] = (short)(int)dVar6;
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar3);
    }
  }
  operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return (bool)extraout_AL;
}

Assistant:

bool readWaveform(std::ifstream & fin, TWaveformT<TSample> & res, int32_t offset, std::streamsize size) {
        if (std::is_same<TSample, TSampleI16>::value) {
            std::vector<TSampleInput> buf(size/sizeof(TSampleInput));
            res.resize(offset + size/sizeof(TSampleInput));
            fin.read((char *)(buf.data()), size);
            double amax = calcAbsMax(buf);
            double iamax = amax != 0.0 ? 1.0/amax : 1.0;
            for (auto i = 0; i < (int) buf.size(); ++i) res[offset + i] = std::round(std::numeric_limits<TSampleI16>::max()*(buf[i]*iamax));
        } else if (std::is_same<TSample, TSampleF>::value) {
            res.resize(offset + size/sizeof(TSample));
            fin.read((char *)(res.data() + offset), size);
        } else {
            return false;
        }
        return true;
    }